

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldAccessor::Clear(MapFieldAccessor *this,Field *data)

{
  void **ppvVar1;
  int iVar2;
  Rep *pRVar3;
  RepeatedPtrFieldBase *pRVar4;
  long lVar5;
  
  pRVar4 = MapFieldBase::MutableRepeatedField((MapFieldBase *)data);
  iVar2 = pRVar4->current_size_;
  if (0 < (long)iVar2) {
    pRVar3 = pRVar4->rep_;
    lVar5 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar5;
      lVar5 = lVar5 + 1;
      (**(code **)(**ppvVar1 + 0x38))();
    } while (iVar2 != lVar5);
    pRVar4->current_size_ = 0;
  }
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }